

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# msd_ce.cpp
# Opt level: O2

void msd_CE4(uchar **strings,size_t n,size_t depth)

{
  ushort uVar1;
  uchar *puVar2;
  size_t sVar3;
  uint16_t uVar4;
  size_t i_1;
  void *__ptr;
  long *__ptr_00;
  void *__src;
  size_t i_2;
  long lVar5;
  size_t i_3;
  long lVar6;
  size_t i;
  size_t sVar7;
  
  if (n < 0x10000) {
    msd_CE2_16bit(strings,n,depth);
    return;
  }
  __ptr = malloc(n * 2);
  for (sVar7 = 0; n != sVar7; sVar7 = sVar7 + 1) {
    uVar4 = get_char<unsigned_short>(strings[sVar7],depth);
    *(uint16_t *)((long)__ptr + sVar7 * 2) = uVar4;
  }
  __ptr_00 = (long *)calloc(0x10000,8);
  for (sVar7 = 0; n != sVar7; sVar7 = sVar7 + 1) {
    __ptr_00[*(ushort *)((long)__ptr + sVar7 * 2)] =
         __ptr_00[*(ushort *)((long)__ptr + sVar7 * 2)] + 1;
  }
  __src = malloc(n * 8);
  msd_CE4::bucketindex[0] = 0;
  sVar7 = 0;
  for (lVar5 = 0; lVar5 != 0xffff; lVar5 = lVar5 + 1) {
    sVar7 = sVar7 + __ptr_00[lVar5];
    msd_CE4::bucketindex[lVar5 + 1] = sVar7;
  }
  for (sVar7 = 0; n != sVar7; sVar7 = sVar7 + 1) {
    puVar2 = strings[sVar7];
    uVar1 = *(ushort *)((long)__ptr + sVar7 * 2);
    sVar3 = msd_CE4::bucketindex[uVar1];
    msd_CE4::bucketindex[uVar1] = sVar3 + 1;
    *(uchar **)((long)__src + sVar3 * 8) = puVar2;
  }
  memcpy(strings,__src,n * 8);
  free(__src);
  free(__ptr);
  lVar5 = *__ptr_00;
  for (lVar6 = 1; lVar6 != 0x10000; lVar6 = lVar6 + 1) {
    sVar7 = __ptr_00[lVar6];
    if (sVar7 != 0) {
      if ((char)lVar6 != '\0') {
        msd_CE4(strings + lVar5,sVar7,depth + 2);
      }
      lVar5 = lVar5 + sVar7;
    }
  }
  free(__ptr_00);
  return;
}

Assistant:

static void
msd_CE4(unsigned char** strings, size_t n, size_t depth)
{
	if (n < 0x10000) {
		msd_CE2_16bit(strings, n, depth);
		return;
	}
	uint16_t* restrict oracle =
		(uint16_t*) malloc(n*sizeof(uint16_t));
	for (size_t i=0; i < n; ++i)
		oracle[i] = get_char<uint16_t>(strings[i], depth);
	size_t* restrict bucketsize = (size_t*)
		calloc(0x10000, sizeof(size_t));
	for (size_t i=0; i < n; ++i)
		++bucketsize[oracle[i]];
	unsigned char** sorted = (unsigned char**)
		malloc(n*sizeof(unsigned char*));
	static size_t bucketindex[0x10000];
	bucketindex[0] = 0;
	for (size_t i=1; i < 0x10000; ++i)
		bucketindex[i] = bucketindex[i-1]+bucketsize[i-1];
	for (size_t i=0; i < n; ++i)
		sorted[bucketindex[oracle[i]]++] = strings[i];
	memcpy(strings, sorted, n*sizeof(unsigned char*));
	free(sorted);
	free(oracle);
	size_t bsum = bucketsize[0];
	for (size_t i=1; i < 0x10000; ++i) {
		if (bucketsize[i] == 0) continue;
		if (i & 0xFF) msd_CE4(strings+bsum,
				bucketsize[i], depth+2);
		bsum += bucketsize[i];
	}
	free(bucketsize);
}